

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetMessage
          (ExtensionSet *this,int number,Descriptor *message_type,MessageFactory *factory)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar1;
  Extension *pEVar2;
  undefined8 uVar3;
  long *in_RCX;
  undefined8 in_RDX;
  Extension *extension;
  int in_stack_ffffffffffffff34;
  ExtensionSet *in_stack_ffffffffffffff38;
  MessageLite *local_8;
  
  pEVar2 = FindOrNull(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  if ((pEVar2 == (Extension *)0x0) || ((pEVar2->field_0xa & 1) != 0)) {
    local_8 = (MessageLite *)(**(code **)(*in_RCX + 0x10))(in_RCX,in_RDX);
  }
  else if (((byte)pEVar2->field_0xa >> 4 & 1) == 0) {
    local_8 = (MessageLite *)(pEVar2->field_0).int64_value;
  }
  else {
    pRVar1 = (pEVar2->field_0).repeated_string_value;
    uVar3 = (**(code **)(*in_RCX + 0x10))(in_RCX,in_RDX);
    local_8 = (MessageLite *)
              (**(code **)((pRVar1->super_RepeatedPtrFieldBase).arena_ + 0x18))(pRVar1,uVar3);
  }
  return local_8;
}

Assistant:

const MessageLite& ExtensionSet::GetMessage(int number,
                                            const Descriptor* message_type,
                                            MessageFactory* factory) const {
  const Extension* extension = FindOrNull(number);
  if (extension == NULL || extension->is_cleared) {
    // Not present.  Return the default value.
    return *factory->GetPrototype(message_type);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    if (extension->is_lazy) {
      return extension->lazymessage_value->GetMessage(
          *factory->GetPrototype(message_type));
    } else {
      return *extension->message_value;
    }
  }
}